

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O1

void CompatibilityCVT_Resampler(SDL12_AudioCVT *cvt12,Uint16 format)

{
  Uint8 UVar1;
  undefined2 uVar2;
  int iVar3;
  Uint8 *pUVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  char cVar8;
  long lVar9;
  long lVar10;
  
  cVar8 = (char)format;
  if (1.0 < cvt12->rate_incr || cvt12->rate_incr == 1.0) {
    if (cVar8 == '\x10') {
      uVar5 = cvt12->len_cvt;
      if (3 < uVar5) {
        pUVar4 = cvt12->buf;
        lVar10 = 0;
        do {
          *(undefined2 *)(pUVar4 + lVar10 * 2) = *(undefined2 *)(pUVar4 + lVar10 * 4);
          lVar10 = lVar10 + 1;
        } while ((int)uVar5 >> 2 != (int)lVar10);
      }
    }
    else if ((cVar8 == '\b') && (uVar5 = cvt12->len_cvt, 1 < uVar5)) {
      pUVar4 = cvt12->buf;
      lVar10 = 0;
      do {
        pUVar4[lVar10] = pUVar4[lVar10 * 2];
        lVar10 = lVar10 + 1;
      } while ((int)uVar5 >> 1 != (int)lVar10);
    }
    cvt12->len_cvt = cvt12->len_cvt / 2;
  }
  else {
    if (cVar8 == '\x10') {
      iVar3 = cvt12->len_cvt;
      if (1 < (ulong)(long)iVar3) {
        iVar6 = iVar3 >> 1;
        pUVar4 = cvt12->buf;
        lVar10 = 0;
        do {
          uVar2 = *(undefined2 *)(pUVar4 + lVar10 + ((long)iVar3 - 2U));
          *(undefined2 *)(pUVar4 + lVar10 * 2 + (long)(iVar3 * 2) + -2) = uVar2;
          *(undefined2 *)(pUVar4 + lVar10 * 2 + (long)(iVar3 * 2) + -4) = uVar2;
          lVar10 = lVar10 + -2;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
    }
    else if (cVar8 == '\b') {
      iVar3 = cvt12->len_cvt;
      uVar7 = (ulong)iVar3;
      if (uVar7 != 0) {
        pUVar4 = cvt12->buf;
        lVar10 = uVar7 - 1;
        lVar9 = 0;
        do {
          UVar1 = pUVar4[lVar9 + lVar10];
          pUVar4[lVar9 * 2 + (long)(iVar3 * 2) + -1] = UVar1;
          pUVar4[lVar9 * 2 + (long)(iVar3 * 2) + -2] = UVar1;
          lVar9 = lVar9 + -1;
          uVar5 = (int)uVar7 - 1;
          uVar7 = (ulong)uVar5;
        } while (uVar5 != 0);
      }
    }
    cvt12->len_cvt = cvt12->len_cvt << 1;
  }
  iVar3 = cvt12->filter_index;
  cvt12->filter_index = iVar3 + 1;
  if (cvt12->filters[(long)iVar3 + 1] == (SDL12_AudioCVTFilter)0x0) {
    return;
  }
  (*cvt12->filters[(long)iVar3 + 1])(cvt12,format);
  return;
}

Assistant:

static void SDLCALL
CompatibilityCVT_Resampler(SDL12_AudioCVT *cvt12, Uint16 format)
{
    const int bitsize = (int) SDL_AUDIO_BITSIZE(format);
    int i;

    SDL_assert((bitsize == 8) || (bitsize == 16));  /* there were no 32-bit audio types in 1.2. */

    if (cvt12->rate_incr < 1.0) {   /* upsampling */
        /*printf("2x Upsampling!\n");*/
        #define DO_RESAMPLE(typ) \
            const typ *src = (const typ *) (cvt12->buf + cvt12->len_cvt); \
            typ *dst = (typ *) (cvt12->buf + (cvt12->len_cvt * 2)); \
            for (i = cvt12->len_cvt / sizeof (typ); i; i--) { \
                const typ sample = *(--src); \
                dst -= 2; \
                dst[0] = dst[1] = sample; \
            }
        if (bitsize == 8) {
            DO_RESAMPLE(Uint8);
        } else if (bitsize == 16) {
            DO_RESAMPLE(Uint16);
        }
        #undef DO_RESAMPLE
        cvt12->len_cvt *= 2;
    } else {  /* downsampling. */
        /*printf("2x Downsampling!\n");*/
        #define DO_RESAMPLE(typ) \
            const typ *src = (const typ *) cvt12->buf; \
            typ *dst = (typ *) cvt12->buf; \
            for (i = cvt12->len_cvt / (sizeof (typ) * 2); i; i--, src += 2) { \
                *(dst++) = *src; \
            }
        if (bitsize == 8) {
            DO_RESAMPLE(Uint8);
        } else if (bitsize == 16) {
            DO_RESAMPLE(Uint16);
        }
        #undef DO_RESAMPLE
        cvt12->len_cvt /= 2;
    }

    if (cvt12->filters[++cvt12->filter_index]) {
        cvt12->filters[cvt12->filter_index](cvt12, format);
    }
}